

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O2

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt,lgx_str_t *key)

{
  lgx_rb_node_t *plVar1;
  lgx_rb_t *plVar2;
  longlong lVar3;
  lgx_rb_node_t *plVar4;
  
  plVar2 = rbt;
  plVar4 = (lgx_rb_node_t *)0x0;
  while (plVar1 = plVar2->root, plVar1 != (lgx_rb_node_t *)0x0) {
    lVar3 = rb_compare(rbt,&plVar1->key,key);
    plVar2 = (lgx_rb_t *)(&plVar1->left + (lVar3 < 1));
    if (0 < lVar3) {
      plVar4 = plVar1;
    }
  }
  return plVar4;
}

Assistant:

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt, lgx_str_t *key) {
    lgx_rb_node_t *node, *ret = NULL;
    
    node = rbt->root;
    
    while(node) {
        if(rb_compare(rbt, &node->key, key) > 0) {
            ret = node;
            node = node->left;
        } else {
            node = node->right;
        }
    }
    
    return ret;
}